

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenUnPackForScalar
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string struct_var;
  undefined1 local_70 [8];
  string field_method;
  string field_field;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Field_abi_cxx11_((string *)((long)&field_method.field_2 + 8),&this->namer_,field);
  Namer::Method<flatbuffers::FieldDef>((string *)local_70,&(this->namer_).super_Namer,field);
  IdlNamer::Variable_abi_cxx11_((string *)local_a0,&this->namer_,struct_def);
  GenIndents_abi_cxx11_(&local_1a0,this,2);
  std::operator+(&local_180,&local_1a0,"self.");
  std::operator+(&local_160,&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_method.field_2 + 8));
  std::operator+(&local_140,&local_160," = ");
  std::operator+(&local_120,&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::operator+(&local_100,&local_120,".");
  std::operator+(&local_e0,&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_c0,&local_e0,"()");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(field_method.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenUnPackForScalar(const StructDef &struct_def, const FieldDef &field,
                          std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_var = namer_.Variable(struct_def);

    code += GenIndents(2) + "self." + field_field + " = " + struct_var + "." +
            field_method + "()";
  }